

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFMatrixRef.h
# Opt level: O1

void __thiscall
TPZFMatrixRef<long_double>::TPZFMatrixRef
          (TPZFMatrixRef<long_double> *this,int64_t rows,longdouble **buf)

{
  longdouble *plVar1;
  int64_t size;
  
  plVar1 = *buf;
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = rows
  ;
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0186b0e8;
  (this->super_TPZFMatrix<long_double>).fElem = plVar1;
  (this->super_TPZFMatrix<long_double>).fGiven = plVar1;
  (this->super_TPZFMatrix<long_double>).fSize = rows;
  TPZVec<int>::TPZVec(&(this->super_TPZFMatrix<long_double>).fPivot.super_TPZVec<int>,0);
  (this->super_TPZFMatrix<long_double>).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->super_TPZFMatrix<long_double>).fPivot.super_TPZVec<int>.fStore =
       (this->super_TPZFMatrix<long_double>).fPivot.fExtAlloc;
  (this->super_TPZFMatrix<long_double>).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->super_TPZFMatrix<long_double>).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->super_TPZFMatrix<long_double>).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  (this->super_TPZFMatrix<long_double>).fWork.fStore = (longdouble *)0x0;
  (this->super_TPZFMatrix<long_double>).fWork.fNElements = 0;
  (this->super_TPZFMatrix<long_double>).fWork.fNAlloc = 0;
  if (rows == 0) {
    (this->super_TPZFMatrix<long_double>).fElem = (longdouble *)0x0;
  }
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrixRef_0186adf8;
  this->fOrigRef = buf;
  return;
}

Assistant:

TPZFMatrixRef(const int64_t rows, TVar * &buf) :
    TPZFMatrix<TVar>(rows,1,buf,rows), fOrigRef(buf) {}